

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode parse_numericrange(UA_String *str,UA_NumericRange *range)

{
  UA_NumericRangeDimension *pUVar1;
  size_t sVar2;
  ulong uVar3;
  size_t progress;
  size_t newdssize;
  UA_NumericRangeDimension *newds;
  size_t offset;
  UA_NumericRangeDimension *pUStack_30;
  UA_StatusCode retval;
  UA_NumericRangeDimension *dimensions;
  size_t dimensionsMax;
  size_t idx;
  UA_NumericRange *range_local;
  UA_String *str_local;
  
  dimensionsMax = 0;
  dimensions = (UA_NumericRangeDimension *)0x0;
  pUStack_30 = (UA_NumericRangeDimension *)0x0;
  offset._4_4_ = 0;
  newds = (UA_NumericRangeDimension *)0x0;
  while( true ) {
    if (dimensions <= dimensionsMax) {
      pUVar1 = (UA_NumericRangeDimension *)
               realloc(pUStack_30,(long)((long)&dimensions->min + 2) * 8);
      if (pUVar1 == (UA_NumericRangeDimension *)0x0) {
        offset._4_4_ = 0x80030000;
        goto LAB_0012581e;
      }
      dimensions = (UA_NumericRangeDimension *)((long)&dimensions->min + 2);
      pUStack_30 = pUVar1;
    }
    sVar2 = readDimension(str->data + (long)newds,str->length - (long)newds,
                          pUStack_30 + dimensionsMax);
    if (sVar2 == 0) {
      offset._4_4_ = 0x80360000;
      goto LAB_0012581e;
    }
    uVar3 = (long)&newds->min + sVar2;
    dimensionsMax = dimensionsMax + 1;
    if (str->length <= uVar3) goto LAB_0012581e;
    if (str->data[uVar3] != ',') break;
    newds = (UA_NumericRangeDimension *)(uVar3 + 1);
  }
  offset._4_4_ = 0x80360000;
LAB_0012581e:
  if ((offset._4_4_ == 0) && (dimensionsMax != 0)) {
    range->dimensions = pUStack_30;
    range->dimensionsSize = dimensionsMax;
  }
  else {
    free(pUStack_30);
  }
  return offset._4_4_;
}

Assistant:

UA_StatusCode
parse_numericrange(const UA_String *str, UA_NumericRange *range) {
    size_t idx = 0;
    size_t dimensionsMax = 0;
    UA_NumericRangeDimension *dimensions = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    size_t offset = 0;
    while(true) {
        /* alloc dimensions */
        if(idx >= dimensionsMax) {
            UA_NumericRangeDimension *newds;
            size_t newdssize = sizeof(UA_NumericRangeDimension) * (dimensionsMax + 2);
            newds = UA_realloc(dimensions, newdssize);
            if(!newds) {
                retval = UA_STATUSCODE_BADOUTOFMEMORY;
                break;
            }
            dimensions = newds;
            dimensionsMax = dimensionsMax + 2;
        }

        /* read the dimension */
        size_t progress = readDimension(&str->data[offset], str->length - offset,
                                        &dimensions[idx]);
        if(progress == 0) {
            retval = UA_STATUSCODE_BADINDEXRANGEINVALID;
            break;
        }
        offset += progress;
        ++idx;

        /* loop into the next dimension */
        if(offset >= str->length)
            break;

        if(str->data[offset] != ',') {
            retval = UA_STATUSCODE_BADINDEXRANGEINVALID;
            break;
        }
        ++offset;
    }

    if(retval == UA_STATUSCODE_GOOD && idx > 0) {
        range->dimensions = dimensions;
        range->dimensionsSize = idx;
    } else
        UA_free(dimensions);

    return retval;
}